

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::ConfidentialTransactionContext::SplitTxOut
          (ConfidentialTransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *locking_script_list,
          vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
          *nonce_list)

{
  pointer pAVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  CfdException *pCVar5;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  long lVar6;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *__range1;
  Amount *amount;
  pointer pAVar7;
  long lVar8;
  ulong uVar9;
  Amount total_amount;
  ConfidentialAssetId fee_asset;
  ConfidentialAssetId asset;
  ByteData prev_tx;
  ConfidentialTxOutReference ref;
  string local_210;
  undefined8 local_1f0;
  undefined1 local_1e8;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *local_1e0;
  ConfidentialAssetId local_1d8;
  Script local_1b0;
  undefined1 *local_178;
  size_t local_170;
  undefined1 local_168 [16];
  undefined8 local_158;
  undefined1 local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined1 local_138 [24];
  Script local_120;
  ConfidentialAssetId local_e8;
  ConfidentialValue local_c0 [3];
  undefined8 local_40;
  undefined1 local_38;
  
  local_1e0 = nonce_list;
  if ((SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
       ::kMinimumAmount == '\0') &&
     (iVar4 = __cxa_guard_acquire(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                                   ::kMinimumAmount), iVar4 != 0)) {
    cfd::core::Amount::Amount
              ((Amount *)
               &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount,100);
    __cxa_guard_release(&SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                         ::kMinimumAmount);
  }
  pAVar7 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pAVar1 - (long)pAVar7 >> 4;
  if ((lVar6 != ((long)(locking_script_list->
                       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(locking_script_list->
                       super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) ||
     (lVar6 != ((long)(local_1e0->
                      super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_1e0->
                      super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Unmatch each list count.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (pAVar7 == pAVar1) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"list is empty.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_138);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar2 = HasBlinding(this);
  if (bVar2) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_138._0_8_ = local_138 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"Already blinded.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_138);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialTransaction::GetTxOut((uint)local_138);
  cfd::core::Script::Script(&local_1b0,&local_120);
  cVar3 = cfd::core::Script::IsEmpty();
  core::Script::~Script(&local_1b0);
  if (cVar3 != '\0') {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1b0._vptr_Script =
         (_func_int **)
         ((long)&local_1b0.script_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Target is fee output.","")
    ;
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_1b0);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&local_1b0,&local_e8);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_1d8,local_c0);
  local_158 = cfd::core::ConfidentialValue::GetAmount();
  local_1d8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialValue_002b2e40;
  local_150 = extraout_DL;
  if (local_1d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Amount::Amount((Amount *)&local_1f0);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_1d8);
  local_40 = GetFeeAmount(this,&local_1d8);
  local_38 = extraout_DL_00;
  cVar3 = cfd::core::operator>((Amount *)&local_40,0);
  if (cVar3 == '\0') {
    bVar2 = false;
  }
  else {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
    if (local_210._M_string_length == local_170) {
      if (local_210._M_string_length == 0) {
        bVar2 = true;
      }
      else {
        iVar4 = bcmp(local_210._M_dataplus._M_p,local_178,local_210._M_string_length);
        bVar2 = iVar4 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if (local_178 != local_168) {
      operator_delete(local_178);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    local_1f0 = SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount;
    local_1e8 = DAT_002bc3b0;
  }
  pAVar7 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar7 != pAVar1) {
    do {
      cfd::core::Amount::operator+=((Amount *)&local_1f0,pAVar7);
      pAVar7 = pAVar7 + 0x10;
    } while (pAVar7 != pAVar1);
  }
  cVar3 = cfd::core::operator<((Amount *)&local_158,(Amount *)&local_1f0);
  if (cVar3 != '\0') {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"The Amount is too large.","");
    core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_210);
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (bVar2) {
    cfd::core::Amount::operator-=
              ((Amount *)&local_1f0,
               (Amount *)
               &SplitTxOut(unsigned_int,std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>const&,std::vector<cfd::core::Script,std::allocator<cfd::core::Script>>const&,std::vector<cfd::core::ConfidentialNonce,std::allocator<cfd::core::ConfidentialNonce>>const&)
                ::kMinimumAmount);
  }
  local_148 = cfd::core::operator-((Amount *)&local_158,(Amount *)&local_1f0);
  local_140 = extraout_DL_01;
  (**(code **)(*(long *)this + 0x40))(&local_178,this);
  cfd::core::ConfidentialTransaction::SetTxOutValue((uint)this,(Amount *)(ulong)index);
  if ((amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (amount_list->super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      cVar3 = cfd::core::Script::IsEmpty();
      if (cVar3 != '\0') {
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_210,"Locking script is empty.","");
        core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_210);
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      cfd::core::ConfidentialTransaction::AddTxOut
                ((Amount *)this,
                 (ConfidentialAssetId *)
                 ((amount_list->
                  super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>)._M_impl
                  .super__Vector_impl_data._M_start + lVar6),&local_1b0,
                 (ConfidentialNonce *)
                 ((long)&((locking_script_list->
                          super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->_vptr_Script + lVar8));
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x38;
      lVar6 = lVar6 + 0x10;
    } while (uVar9 < (ulong)((long)(amount_list->
                                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(amount_list->
                                   super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (local_178 != (undefined1 *)0x0) {
    operator_delete(local_178);
  }
  local_1d8._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
  if (local_1d8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_1b0._vptr_Script = (_func_int **)&PTR__ConfidentialAssetId_002b2ea0;
  if (local_1b0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_138);
  return;
}

Assistant:

void ConfidentialTransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Script>& locking_script_list,
    const std::vector<ConfidentialNonce>& nonce_list) {
  static const Amount kMinimumAmount(int64_t{100});

  if ((amount_list.size() != locking_script_list.size()) ||
      (amount_list.size() != nonce_list.size())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch each list count.");
  } else if (amount_list.empty()) {
    throw CfdException(CfdError::kCfdIllegalArgumentError, "list is empty.");
  } else if (HasBlinding()) {
    throw CfdException(CfdError::kCfdIllegalStateError, "Already blinded.");
  }

  auto ref = GetTxOut(index);
  if (ref.GetLockingScript().IsEmpty()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target is fee output.");
  }

  auto asset = ref.GetAsset();
  auto base_amount = ref.GetConfidentialValue().GetAmount();
  Amount total_amount;
  ConfidentialAssetId fee_asset;
  auto fee = GetFeeAmount(&fee_asset);
  bool has_fee_asset = false;
  if (fee > 0) {
    has_fee_asset = (asset.GetHex() == fee_asset.GetHex());
    total_amount = kMinimumAmount;
  }

  for (const auto& amount : amount_list) total_amount += amount;

  if (base_amount < total_amount) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "The Amount is too large.");
  }
  if (has_fee_asset) total_amount -= kMinimumAmount;
  Amount update_amount = base_amount - total_amount;

  ByteData prev_tx = GetData();
  try {
    SetTxOutValue(index, update_amount);
    for (size_t txout_idx = 0; txout_idx < amount_list.size(); ++txout_idx) {
      if (locking_script_list[txout_idx].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Locking script is empty.");
      }
      AddTxOut(
          amount_list[txout_idx], asset, locking_script_list[txout_idx],
          nonce_list[txout_idx]);
    }
  } catch (const CfdException& except) {
    SetFromHex(prev_tx.GetHex());  // rollback
    throw except;
  }
}